

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  lighttable_t *plVar1;
  bool bVar2;
  BYTE *pBVar3;
  lighttable_t *plVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  short sVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  short *psVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  double dVar22;
  undefined1 auVar23 [16];
  int iVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar60 [16];
  long lVar63;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar88;
  int iVar91;
  undefined1 auVar89 [16];
  int iVar92;
  undefined1 auVar90 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar94 [16];
  double dVar95;
  undefined1 auVar96 [16];
  
  auVar96 = _DAT_0073c1b0;
  auVar86 = _DAT_0073b300;
  dVar95 = (double)((float)(~x1 + x2) * rw_lightstep + rw_light);
  iVar9 = x2 + -1;
  lVar19 = (long)x2;
  uVar11 = (uint)uclip[lVar19 + -1];
  uVar18 = (uint)dclip[lVar19 + -1];
  dVar22 = 24.0;
  if (dVar95 <= 24.0) {
    dVar22 = dVar95;
  }
  iVar5 = wallshade - SUB84(dVar22 + 103079215104.0,0) >> 0x10;
  iVar88 = 0x1f;
  if (iVar5 < 0x1f) {
    iVar88 = iVar5;
  }
  iVar5 = 0;
  if (0 < iVar88) {
    iVar5 = iVar88;
  }
  plVar1 = basecolormap->Maps;
  if (uclip[lVar19 + -1] < dclip[lVar19 + -1]) {
    lVar12 = (ulong)(uVar18 - uVar11) - 1;
    auVar23._8_4_ = (int)lVar12;
    auVar23._0_8_ = lVar12;
    auVar23._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = (long)(int)uVar11 * 2;
    uVar15 = 0;
    auVar23 = auVar23 ^ _DAT_0073b300;
    in_XMM6._8_4_ = 0xffffffff;
    in_XMM6._0_8_ = 0xffffffffffffffff;
    in_XMM6._12_4_ = 0xffffffff;
    auVar28 = _DAT_0073c180;
    auVar35 = _DAT_0073c190;
    auVar61 = _DAT_0073c1a0;
    auVar70 = _DAT_0073b2f0;
    do {
      auVar75 = auVar70 ^ auVar86;
      iVar88 = auVar23._0_4_;
      iVar87 = -(uint)(iVar88 < auVar75._0_4_);
      iVar74 = auVar23._4_4_;
      auVar76._4_4_ = -(uint)(iVar74 < auVar75._4_4_);
      iVar92 = auVar23._8_4_;
      iVar91 = -(uint)(iVar92 < auVar75._8_4_);
      iVar27 = auVar23._12_4_;
      auVar76._12_4_ = -(uint)(iVar27 < auVar75._12_4_);
      auVar84._4_4_ = iVar87;
      auVar84._0_4_ = iVar87;
      auVar84._8_4_ = iVar91;
      auVar84._12_4_ = iVar91;
      auVar93 = pshuflw(in_XMM11,auVar84,0xe8);
      auVar82._4_4_ = -(uint)(auVar75._4_4_ == iVar74);
      auVar82._12_4_ = -(uint)(auVar75._12_4_ == iVar27);
      auVar82._0_4_ = auVar82._4_4_;
      auVar82._8_4_ = auVar82._12_4_;
      auVar94 = pshuflw(in_XMM12,auVar82,0xe8);
      auVar76._0_4_ = auVar76._4_4_;
      auVar76._8_4_ = auVar76._12_4_;
      auVar75 = pshuflw(auVar93,auVar76,0xe8);
      auVar75 = (auVar75 | auVar94 & auVar93) ^ in_XMM6;
      auVar75 = packssdw(auVar75,auVar75);
      sVar8 = (short)iVar9;
      if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        spanend[(long)(int)uVar11 + uVar15] = sVar8;
      }
      auVar76 = auVar82 & auVar84 | auVar76;
      auVar75 = packssdw(auVar76,auVar76);
      auVar75 = packssdw(auVar75 ^ in_XMM6,auVar75 ^ in_XMM6);
      if ((auVar75._0_4_ >> 0x10 & 1) != 0) {
        *(short *)(lVar12 + 0x8f16c2 + uVar15 * 2) = sVar8;
      }
      auVar82 = auVar61 ^ auVar86;
      iVar87 = -(uint)(iVar88 < auVar82._0_4_);
      auVar89._4_4_ = -(uint)(iVar74 < auVar82._4_4_);
      iVar91 = -(uint)(iVar92 < auVar82._8_4_);
      auVar89._12_4_ = -(uint)(iVar27 < auVar82._12_4_);
      auVar75._4_4_ = iVar87;
      auVar75._0_4_ = iVar87;
      auVar75._8_4_ = iVar91;
      auVar75._12_4_ = iVar91;
      auVar83._4_4_ = -(uint)(auVar82._4_4_ == iVar74);
      auVar83._12_4_ = -(uint)(auVar82._12_4_ == iVar27);
      auVar83._0_4_ = auVar83._4_4_;
      auVar83._8_4_ = auVar83._12_4_;
      auVar89._0_4_ = auVar89._4_4_;
      auVar89._8_4_ = auVar89._12_4_;
      auVar82 = auVar83 & auVar75 | auVar89;
      auVar82 = packssdw(auVar82,auVar82);
      auVar82 = packssdw(auVar82 ^ in_XMM6,auVar82 ^ in_XMM6);
      if ((auVar82 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(lVar12 + 0x8f16c4 + uVar15 * 2) = sVar8;
      }
      auVar75 = pshufhw(auVar75,auVar75,0x84);
      auVar84 = pshufhw(auVar83,auVar83,0x84);
      auVar76 = pshufhw(auVar75,auVar89,0x84);
      auVar75 = (auVar76 | auVar84 & auVar75) ^ in_XMM6;
      auVar75 = packssdw(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(lVar12 + 0x8f16c6 + uVar15 * 2) = sVar8;
      }
      auVar75 = auVar35 ^ auVar86;
      iVar87 = -(uint)(iVar88 < auVar75._0_4_);
      auVar78._4_4_ = -(uint)(iVar74 < auVar75._4_4_);
      iVar91 = -(uint)(iVar92 < auVar75._8_4_);
      auVar78._12_4_ = -(uint)(iVar27 < auVar75._12_4_);
      auVar85._4_4_ = iVar87;
      auVar85._0_4_ = iVar87;
      auVar85._8_4_ = iVar91;
      auVar85._12_4_ = iVar91;
      auVar82 = pshuflw(auVar82,auVar85,0xe8);
      auVar77._4_4_ = -(uint)(auVar75._4_4_ == iVar74);
      auVar77._12_4_ = -(uint)(auVar75._12_4_ == iVar27);
      auVar77._0_4_ = auVar77._4_4_;
      auVar77._8_4_ = auVar77._12_4_;
      auVar75 = pshuflw(auVar94 & auVar93,auVar77,0xe8);
      in_XMM12 = auVar75 & auVar82;
      auVar78._0_4_ = auVar78._4_4_;
      auVar78._8_4_ = auVar78._12_4_;
      auVar75 = pshuflw(auVar82,auVar78,0xe8);
      auVar75 = (auVar75 | in_XMM12) ^ in_XMM6;
      auVar75 = packssdw(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(lVar12 + 0x8f16c8 + uVar15 * 2) = sVar8;
      }
      auVar78 = auVar77 & auVar85 | auVar78;
      auVar75 = packssdw(auVar78,auVar78);
      auVar75 = packssdw(auVar75 ^ in_XMM6,auVar75 ^ in_XMM6);
      if ((auVar75 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(short *)(lVar12 + 0x8f16ca + uVar15 * 2) = sVar8;
      }
      auVar75 = auVar28 ^ auVar86;
      iVar88 = -(uint)(iVar88 < auVar75._0_4_);
      auVar90._4_4_ = -(uint)(iVar74 < auVar75._4_4_);
      iVar92 = -(uint)(iVar92 < auVar75._8_4_);
      auVar90._12_4_ = -(uint)(iVar27 < auVar75._12_4_);
      auVar93._4_4_ = iVar88;
      auVar93._0_4_ = iVar88;
      auVar93._8_4_ = iVar92;
      auVar93._12_4_ = iVar92;
      auVar94._4_4_ = -(uint)(auVar75._4_4_ == iVar74);
      auVar94._12_4_ = -(uint)(auVar75._12_4_ == iVar27);
      auVar94._0_4_ = auVar94._4_4_;
      auVar94._8_4_ = auVar94._12_4_;
      auVar90._0_4_ = auVar90._4_4_;
      auVar90._8_4_ = auVar90._12_4_;
      auVar75 = auVar94 & auVar93 | auVar90;
      auVar75 = packssdw(auVar75,auVar75);
      in_XMM11 = packssdw(auVar75 ^ in_XMM6,auVar75 ^ in_XMM6);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(lVar12 + 0x8f16cc + uVar15 * 2) = sVar8;
      }
      auVar75 = pshufhw(auVar93,auVar93,0x84);
      auVar82 = pshufhw(auVar94,auVar94,0x84);
      in_XMM9 = auVar82 & auVar75;
      auVar75 = pshufhw(auVar75,auVar90,0x84);
      auVar75 = (auVar75 | in_XMM9) ^ in_XMM6;
      auVar75 = packssdw(auVar75,auVar75);
      if ((auVar75 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(lVar12 + 0x8f16ce + uVar15 * 2) = sVar8;
      }
      uVar15 = uVar15 + 8;
      lVar21 = auVar70._8_8_;
      lVar7 = auVar96._0_8_;
      auVar70._0_8_ = auVar70._0_8_ + lVar7;
      lVar13 = auVar96._8_8_;
      auVar70._8_8_ = lVar21 + lVar13;
      lVar21 = auVar61._8_8_;
      auVar61._0_8_ = auVar61._0_8_ + lVar7;
      auVar61._8_8_ = lVar21 + lVar13;
      lVar21 = auVar35._8_8_;
      auVar35._0_8_ = auVar35._0_8_ + lVar7;
      auVar35._8_8_ = lVar21 + lVar13;
      lVar21 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + lVar7;
      auVar28._8_8_ = lVar21 + lVar13;
      in_XMM5 = auVar86;
      in_XMM7 = auVar96;
    } while (((ulong)(uVar18 - uVar11) + 7 & 0x1fffffff8) != uVar15);
  }
  dc_colormap = plVar1 + (uint)(iVar5 << 8);
  if (x1 <= (int)(lVar19 + -2)) {
    auVar79._8_4_ = 0xffffffff;
    auVar79._0_8_ = 0xffffffffffffffff;
    auVar79._12_4_ = 0xffffffff;
    lVar21 = 0;
    lVar12 = lVar19 + -2;
    auVar86 = _DAT_0073b300;
    auVar96 = _DAT_0073c180;
    auVar28 = _DAT_0073c190;
    do {
      uVar15 = (ulong)uVar18;
      uVar20 = (uint)uclip[lVar12];
      uVar17 = (uint)dclip[lVar12];
      dVar95 = dVar95 - (double)rw_lightstep;
      dVar22 = dVar95;
      if (24.0 <= dVar95) {
        dVar22 = 24.0;
      }
      iVar88 = wallshade - SUB84(dVar22 + 103079215104.0,0) >> 0x10;
      if (0x1e < iVar88) {
        iVar88 = 0x1f;
      }
      if (iVar88 < 1) {
        iVar88 = 0;
      }
      sVar8 = (short)lVar12;
      if (iVar88 == iVar5) {
        uVar6 = uVar18;
        if ((int)uVar20 < (int)uVar18) {
          uVar6 = uVar20;
        }
        if (dc_colormap == plVar1) {
          if ((int)uVar11 <= (int)uVar6) {
            uVar11 = uVar6;
          }
          uVar6 = uVar11;
          if ((int)uVar11 < (int)uVar17) {
            uVar6 = uVar17;
          }
          if ((int)uVar6 <= (int)uVar18) {
            uVar15 = (ulong)uVar6;
          }
        }
        else {
          if ((int)uVar11 < (int)uVar6) {
            lVar7 = (long)(int)uVar11;
            do {
              plVar4 = dc_colormap;
              pBVar3 = dc_destorg;
              iVar88 = (int)spanend[lVar7];
              if (spanend[lVar7] < iVar9) {
                iVar88 = iVar9;
              }
              lVar13 = (long)ylookup[lVar7] + lVar19 + -1;
              lVar16 = lVar21;
              do {
                pBVar3[lVar16 + lVar13] = plVar4[pBVar3[lVar16 + lVar13]];
                lVar16 = lVar16 + 1;
              } while (iVar88 + (2 - x2) != (int)lVar16);
              lVar7 = lVar7 + 1;
              uVar11 = uVar6;
            } while (lVar7 != (int)uVar6);
          }
          uVar6 = uVar11;
          if ((int)uVar11 < (int)uVar17) {
            uVar6 = uVar17;
          }
          if ((int)uVar6 < (int)uVar18) {
            uVar15 = (ulong)(int)uVar18;
            do {
              plVar4 = dc_colormap;
              pBVar3 = dc_destorg;
              lVar13 = uVar15 + 0x167f;
              lVar7 = uVar15 * 4;
              uVar15 = uVar15 - 1;
              iVar88 = (int)ceilingclip[lVar13];
              if (ceilingclip[lVar13] < iVar9) {
                iVar88 = iVar9;
              }
              lVar7 = (long)*(int *)(&DAT_008b077c + lVar7) + lVar19 + -1;
              lVar13 = lVar21;
              do {
                pBVar3[lVar13 + lVar7] = plVar4[pBVar3[lVar13 + lVar7]];
                lVar13 = lVar13 + 1;
              } while (iVar88 + (2 - x2) != (int)lVar13);
            } while ((long)(int)uVar6 < (long)uVar15);
          }
        }
        uVar18 = uVar17;
        if ((int)uVar11 < (int)uVar17) {
          uVar18 = uVar11;
        }
        if ((int)uVar20 < (int)uVar18) {
          lVar13 = (long)(int)uVar20;
          lVar7 = ((int)uVar18 - lVar13) + -1;
          auVar25._8_4_ = (int)lVar7;
          auVar25._0_8_ = lVar7;
          auVar25._12_4_ = (int)((ulong)lVar7 >> 0x20);
          lVar7 = lVar13 * 2;
          auVar25 = auVar25 ^ auVar86;
          uVar10 = 0;
          do {
            auVar30._8_4_ = (int)uVar10;
            auVar30._0_8_ = uVar10;
            auVar30._12_4_ = (int)(uVar10 >> 0x20);
            auVar35 = (auVar30 | _DAT_0073b2f0) ^ auVar86;
            iVar88 = auVar25._0_4_;
            iVar87 = -(uint)(iVar88 < auVar35._0_4_);
            iVar74 = auVar25._4_4_;
            auVar37._4_4_ = -(uint)(iVar74 < auVar35._4_4_);
            iVar92 = auVar25._8_4_;
            iVar91 = -(uint)(iVar92 < auVar35._8_4_);
            iVar27 = auVar25._12_4_;
            auVar37._12_4_ = -(uint)(iVar27 < auVar35._12_4_);
            auVar44._4_4_ = iVar87;
            auVar44._0_4_ = iVar87;
            auVar44._8_4_ = iVar91;
            auVar44._12_4_ = iVar91;
            auVar61 = pshuflw(in_XMM5,auVar44,0xe8);
            auVar36._4_4_ = -(uint)(auVar35._4_4_ == iVar74);
            auVar36._12_4_ = -(uint)(auVar35._12_4_ == iVar27);
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar70 = pshuflw(in_XMM6,auVar36,0xe8);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar35 = pshuflw(auVar61,auVar37,0xe8);
            auVar35 = (auVar35 | auVar70 & auVar61) ^ auVar79;
            auVar35 = packssdw(auVar35,auVar35);
            if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              spanend[lVar13 + uVar10] = sVar8;
            }
            auVar37 = auVar36 & auVar44 | auVar37;
            auVar35 = packssdw(auVar37,auVar37);
            auVar35 = packssdw(auVar35 ^ auVar79,auVar35 ^ auVar79);
            if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
              *(short *)(lVar7 + 0x8f16c2 + uVar10 * 2) = sVar8;
            }
            auVar35 = (auVar30 | _DAT_0073c1a0) ^ auVar86;
            iVar87 = -(uint)(iVar88 < auVar35._0_4_);
            auVar55._4_4_ = -(uint)(iVar74 < auVar35._4_4_);
            iVar91 = -(uint)(iVar92 < auVar35._8_4_);
            auVar55._12_4_ = -(uint)(iVar27 < auVar35._12_4_);
            auVar38._4_4_ = iVar87;
            auVar38._0_4_ = iVar87;
            auVar38._8_4_ = iVar91;
            auVar38._12_4_ = iVar91;
            auVar45._4_4_ = -(uint)(auVar35._4_4_ == iVar74);
            auVar45._12_4_ = -(uint)(auVar35._12_4_ == iVar27);
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar35 = auVar45 & auVar38 | auVar55;
            auVar35 = packssdw(auVar35,auVar35);
            auVar35 = packssdw(auVar35 ^ auVar79,auVar35 ^ auVar79);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16c4 + uVar10 * 2) = sVar8;
            }
            auVar23 = pshufhw(auVar38,auVar38,0x84);
            auVar82 = pshufhw(auVar45,auVar45,0x84);
            auVar75 = pshufhw(auVar23,auVar55,0x84);
            auVar23 = (auVar75 | auVar82 & auVar23) ^ auVar79;
            auVar23 = packssdw(auVar23,auVar23);
            if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16c6 + uVar10 * 2) = sVar8;
            }
            auVar23 = (auVar30 | auVar28) ^ auVar86;
            iVar87 = -(uint)(iVar88 < auVar23._0_4_);
            auVar40._4_4_ = -(uint)(iVar74 < auVar23._4_4_);
            iVar91 = -(uint)(iVar92 < auVar23._8_4_);
            auVar40._12_4_ = -(uint)(iVar27 < auVar23._12_4_);
            auVar46._4_4_ = iVar87;
            auVar46._0_4_ = iVar87;
            auVar46._8_4_ = iVar91;
            auVar46._12_4_ = iVar91;
            auVar35 = pshuflw(auVar35,auVar46,0xe8);
            auVar39._4_4_ = -(uint)(auVar23._4_4_ == iVar74);
            auVar39._12_4_ = -(uint)(auVar23._12_4_ == iVar27);
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar61 = pshuflw(auVar70 & auVar61,auVar39,0xe8);
            in_XMM6 = auVar61 & auVar35;
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            auVar35 = pshuflw(auVar35,auVar40,0xe8);
            auVar35 = (auVar35 | in_XMM6) ^ auVar79;
            in_XMM5 = packssdw(auVar35,auVar35);
            if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16c8 + uVar10 * 2) = sVar8;
            }
            auVar40 = auVar39 & auVar46 | auVar40;
            auVar35 = packssdw(auVar40,auVar40);
            auVar35 = packssdw(auVar35 ^ auVar79,auVar35 ^ auVar79);
            if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16ca + uVar10 * 2) = sVar8;
            }
            auVar35 = (auVar30 | auVar96) ^ auVar86;
            iVar88 = -(uint)(iVar88 < auVar35._0_4_);
            auVar47._4_4_ = -(uint)(iVar74 < auVar35._4_4_);
            iVar92 = -(uint)(iVar92 < auVar35._8_4_);
            auVar47._12_4_ = -(uint)(iVar27 < auVar35._12_4_);
            auVar41._4_4_ = iVar88;
            auVar41._0_4_ = iVar88;
            auVar41._8_4_ = iVar92;
            auVar41._12_4_ = iVar92;
            auVar31._4_4_ = -(uint)(auVar35._4_4_ == iVar74);
            auVar31._12_4_ = -(uint)(auVar35._12_4_ == iVar27);
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar35 = auVar31 & auVar41 | auVar47;
            auVar35 = packssdw(auVar35,auVar35);
            auVar35 = packssdw(auVar35 ^ auVar79,auVar35 ^ auVar79);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16cc + uVar10 * 2) = sVar8;
            }
            auVar61 = pshufhw(auVar41,auVar41,0x84);
            auVar35 = pshufhw(auVar31,auVar31,0x84);
            auVar70 = pshufhw(auVar61,auVar47,0x84);
            auVar35 = packssdw(auVar35 & auVar61,(auVar70 | auVar35 & auVar61) ^ auVar79);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16ce + uVar10 * 2) = sVar8;
            }
            uVar10 = uVar10 + 8;
          } while ((((int)uVar18 - lVar13) + 7U & 0xfffffffffffffff8) != uVar10);
        }
        if ((int)uVar11 < (int)(uint)uVar15) {
          uVar11 = (uint)uVar15;
        }
        if ((int)uVar11 < (int)uVar17) {
          lVar13 = (long)(int)uVar17;
          lVar7 = (lVar13 - (int)uVar11) + -1;
          auVar26._8_4_ = (int)lVar7;
          auVar26._0_8_ = lVar7;
          auVar26._12_4_ = (int)((ulong)lVar7 >> 0x20);
          psVar14 = ceilingclip + lVar13 + 0x167f;
          uVar15 = 0;
          do {
            auVar32._8_4_ = (int)uVar15;
            auVar32._0_8_ = uVar15;
            auVar32._12_4_ = (int)(uVar15 >> 0x20);
            auVar35 = auVar26 ^ auVar86;
            auVar61 = (auVar32 | _DAT_0073b2f0) ^ auVar86;
            iVar88 = auVar35._0_4_;
            iVar87 = -(uint)(iVar88 < auVar61._0_4_);
            iVar74 = auVar35._4_4_;
            auVar49._4_4_ = -(uint)(iVar74 < auVar61._4_4_);
            iVar92 = auVar35._8_4_;
            iVar91 = -(uint)(iVar92 < auVar61._8_4_);
            iVar27 = auVar35._12_4_;
            auVar49._12_4_ = -(uint)(iVar27 < auVar61._12_4_);
            auVar56._4_4_ = iVar87;
            auVar56._0_4_ = iVar87;
            auVar56._8_4_ = iVar91;
            auVar56._12_4_ = iVar91;
            auVar35 = pshuflw(in_XMM6,auVar56,0xe8);
            auVar48._4_4_ = -(uint)(auVar61._4_4_ == iVar74);
            auVar48._12_4_ = -(uint)(auVar61._12_4_ == iVar27);
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar70 = pshuflw(in_XMM7,auVar48,0xe8);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar61 = pshuflw(auVar35,auVar49,0xe8);
            auVar61 = (auVar61 | auVar70 & auVar35) ^ auVar79;
            auVar61 = packssdw(auVar61,auVar61);
            if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *psVar14 = sVar8;
            }
            auVar49 = auVar48 & auVar56 | auVar49;
            auVar61 = packssdw(auVar49,auVar49);
            auVar61 = packssdw(auVar61 ^ auVar79,auVar61 ^ auVar79);
            if ((auVar61._0_4_ >> 0x10 & 1) != 0) {
              psVar14[-1] = sVar8;
            }
            auVar61 = (auVar32 | _DAT_0073c1a0) ^ auVar86;
            iVar87 = -(uint)(iVar88 < auVar61._0_4_);
            auVar62._4_4_ = -(uint)(iVar74 < auVar61._4_4_);
            iVar91 = -(uint)(iVar92 < auVar61._8_4_);
            auVar62._12_4_ = -(uint)(iVar27 < auVar61._12_4_);
            auVar50._4_4_ = iVar87;
            auVar50._0_4_ = iVar87;
            auVar50._8_4_ = iVar91;
            auVar50._12_4_ = iVar91;
            auVar57._4_4_ = -(uint)(auVar61._4_4_ == iVar74);
            auVar57._12_4_ = -(uint)(auVar61._12_4_ == iVar27);
            auVar57._0_4_ = auVar57._4_4_;
            auVar57._8_4_ = auVar57._12_4_;
            auVar62._0_4_ = auVar62._4_4_;
            auVar62._8_4_ = auVar62._12_4_;
            auVar61 = auVar57 & auVar50 | auVar62;
            auVar61 = packssdw(auVar61,auVar61);
            auVar61 = packssdw(auVar61 ^ auVar79,auVar61 ^ auVar79);
            if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              psVar14[-2] = sVar8;
            }
            auVar23 = pshufhw(auVar50,auVar50,0x84);
            auVar82 = pshufhw(auVar57,auVar57,0x84);
            auVar75 = pshufhw(auVar23,auVar62,0x84);
            auVar23 = (auVar75 | auVar82 & auVar23) ^ auVar79;
            auVar23 = packssdw(auVar23,auVar23);
            if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              psVar14[-3] = sVar8;
            }
            auVar23 = (auVar32 | auVar28) ^ auVar86;
            iVar87 = -(uint)(iVar88 < auVar23._0_4_);
            auVar52._4_4_ = -(uint)(iVar74 < auVar23._4_4_);
            iVar91 = -(uint)(iVar92 < auVar23._8_4_);
            auVar52._12_4_ = -(uint)(iVar27 < auVar23._12_4_);
            auVar58._4_4_ = iVar87;
            auVar58._0_4_ = iVar87;
            auVar58._8_4_ = iVar91;
            auVar58._12_4_ = iVar91;
            auVar61 = pshuflw(auVar61,auVar58,0xe8);
            auVar51._4_4_ = -(uint)(auVar23._4_4_ == iVar74);
            auVar51._12_4_ = -(uint)(auVar23._12_4_ == iVar27);
            auVar51._0_4_ = auVar51._4_4_;
            auVar51._8_4_ = auVar51._12_4_;
            auVar35 = pshuflw(auVar70 & auVar35,auVar51,0xe8);
            in_XMM7 = auVar35 & auVar61;
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar35 = pshuflw(auVar61,auVar52,0xe8);
            auVar35 = (auVar35 | in_XMM7) ^ auVar79;
            in_XMM6 = packssdw(auVar35,auVar35);
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              psVar14[-4] = sVar8;
            }
            auVar52 = auVar51 & auVar58 | auVar52;
            auVar35 = packssdw(auVar52,auVar52);
            auVar35 = packssdw(auVar35 ^ auVar79,auVar35 ^ auVar79);
            if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              psVar14[-5] = sVar8;
            }
            auVar35 = (auVar32 | auVar96) ^ auVar86;
            auVar59._0_4_ = -(uint)(iVar88 < auVar35._0_4_);
            auVar59._4_4_ = -(uint)(iVar74 < auVar35._4_4_);
            auVar59._8_4_ = -(uint)(iVar92 < auVar35._8_4_);
            auVar59._12_4_ = -(uint)(iVar27 < auVar35._12_4_);
            auVar53._4_4_ = auVar59._0_4_;
            auVar53._0_4_ = auVar59._0_4_;
            auVar53._8_4_ = auVar59._8_4_;
            auVar53._12_4_ = auVar59._8_4_;
            auVar33._4_4_ = -(uint)(auVar35._4_4_ == iVar74);
            auVar33._12_4_ = -(uint)(auVar35._12_4_ == iVar27);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar42._4_4_ = auVar59._4_4_;
            auVar42._0_4_ = auVar59._4_4_;
            auVar42._8_4_ = auVar59._12_4_;
            auVar42._12_4_ = auVar59._12_4_;
            in_XMM5 = auVar33 & auVar53 | auVar42;
            auVar35 = packssdw(auVar59,in_XMM5);
            auVar35 = packssdw(auVar35 ^ auVar79,auVar35 ^ auVar79);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              psVar14[-6] = sVar8;
            }
            auVar70 = pshufhw(auVar53,auVar53,0x84);
            auVar35 = pshufhw(auVar33,auVar33,0x84);
            auVar61 = pshufhw(auVar42,auVar42,0x84);
            auVar35 = packssdw(auVar35 & auVar70,(auVar61 | auVar35 & auVar70) ^ auVar79);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              psVar14[-7] = sVar8;
            }
            uVar15 = uVar15 + 8;
            psVar14 = psVar14 + -8;
          } while (((lVar13 - (int)uVar11) + 7U & 0xfffffffffffffff8) != uVar15);
        }
      }
      else {
        if (((int)uVar11 < (int)uVar18) && (iVar5 != 0)) {
          R_DrawFogBoundarySection(uVar11,uVar18,(int)lVar12 + 1);
          auVar86 = _DAT_0073b300;
          auVar96 = _DAT_0073c180;
          auVar28 = _DAT_0073c190;
        }
        if ((int)uVar11 < (int)uVar20) {
          uVar20 = uVar11;
        }
        if ((int)uVar17 < (int)uVar18) {
          uVar17 = uVar18;
        }
        uVar11 = uVar17 - uVar20;
        if (uVar11 != 0 && (int)uVar20 <= (int)uVar17) {
          lVar7 = (ulong)uVar11 - 1;
          auVar24._8_4_ = (int)lVar7;
          auVar24._0_8_ = lVar7;
          auVar24._12_4_ = (int)((ulong)lVar7 >> 0x20);
          lVar7 = (long)(int)uVar20 * 2;
          uVar15 = 0;
          auVar29 = _DAT_0073b2f0;
          auVar34 = _DAT_0073c1a0;
          auVar43 = auVar28;
          auVar54 = auVar96;
          do {
            auVar35 = auVar24 ^ auVar86;
            auVar61 = auVar29 ^ auVar86;
            iVar5 = auVar35._0_4_;
            iVar87 = -(uint)(iVar5 < auVar61._0_4_);
            iVar74 = auVar35._4_4_;
            auVar65._4_4_ = -(uint)(iVar74 < auVar61._4_4_);
            iVar92 = auVar35._8_4_;
            iVar91 = -(uint)(iVar92 < auVar61._8_4_);
            iVar27 = auVar35._12_4_;
            auVar65._12_4_ = -(uint)(iVar27 < auVar61._12_4_);
            auVar71._4_4_ = iVar87;
            auVar71._0_4_ = iVar87;
            auVar71._8_4_ = iVar91;
            auVar71._12_4_ = iVar91;
            auVar35 = pshuflw(in_XMM9,auVar71,0xe8);
            auVar64._4_4_ = -(uint)(auVar61._4_4_ == iVar74);
            auVar64._12_4_ = -(uint)(auVar61._12_4_ == iVar27);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar61 = pshuflw(auVar86,auVar64,0xe8);
            auVar65._0_4_ = auVar65._4_4_;
            auVar65._8_4_ = auVar65._12_4_;
            auVar86 = pshuflw(auVar35,auVar65,0xe8);
            auVar86 = (auVar86 | auVar61 & auVar35) ^ _DAT_0073c430;
            auVar86 = packssdw(auVar86,auVar86);
            if ((auVar86 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              spanend[(long)(int)uVar20 + uVar15] = sVar8;
            }
            auVar65 = auVar64 & auVar71 | auVar65;
            auVar86 = packssdw(auVar65,auVar65);
            auVar86 = packssdw(auVar86 ^ _DAT_0073c430,auVar86 ^ _DAT_0073c430);
            if ((auVar86._0_4_ >> 0x10 & 1) != 0) {
              *(short *)(lVar7 + 0x8f16c2 + uVar15 * 2) = sVar8;
            }
            auVar86 = _DAT_0073b300;
            auVar35 = auVar34 ^ _DAT_0073b300;
            iVar87 = -(uint)(iVar5 < auVar35._0_4_);
            auVar80._4_4_ = -(uint)(iVar74 < auVar35._4_4_);
            iVar91 = -(uint)(iVar92 < auVar35._8_4_);
            auVar80._12_4_ = -(uint)(iVar27 < auVar35._12_4_);
            auVar66._4_4_ = iVar87;
            auVar66._0_4_ = iVar87;
            auVar66._8_4_ = iVar91;
            auVar66._12_4_ = iVar91;
            auVar72._4_4_ = -(uint)(auVar35._4_4_ == iVar74);
            auVar72._12_4_ = -(uint)(auVar35._12_4_ == iVar27);
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar80._0_4_ = auVar80._4_4_;
            auVar80._8_4_ = auVar80._12_4_;
            auVar35 = auVar72 & auVar66 | auVar80;
            auVar35 = packssdw(auVar35,auVar35);
            auVar35 = packssdw(auVar35 ^ _DAT_0073c430,auVar35 ^ _DAT_0073c430);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16c4 + uVar15 * 2) = sVar8;
            }
            auVar61 = pshufhw(auVar66,auVar66,0x84);
            auVar23 = pshufhw(auVar72,auVar72,0x84);
            auVar70 = pshufhw(auVar61,auVar80,0x84);
            auVar61 = (auVar70 | auVar23 & auVar61) ^ _DAT_0073c430;
            auVar61 = packssdw(auVar61,auVar61);
            if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16c6 + uVar15 * 2) = sVar8;
            }
            auVar61 = auVar43 ^ auVar86;
            iVar87 = -(uint)(iVar5 < auVar61._0_4_);
            auVar68._4_4_ = -(uint)(iVar74 < auVar61._4_4_);
            iVar91 = -(uint)(iVar92 < auVar61._8_4_);
            auVar68._12_4_ = -(uint)(iVar27 < auVar61._12_4_);
            auVar73._4_4_ = iVar87;
            auVar73._0_4_ = iVar87;
            auVar73._8_4_ = iVar91;
            auVar73._12_4_ = iVar91;
            auVar35 = pshuflw(auVar35,auVar73,0xe8);
            auVar67._4_4_ = -(uint)(auVar61._4_4_ == iVar74);
            auVar67._12_4_ = -(uint)(auVar61._12_4_ == iVar27);
            auVar67._0_4_ = auVar67._4_4_;
            auVar67._8_4_ = auVar67._12_4_;
            auVar61 = pshuflw(auVar86,auVar67,0xe8);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar86 = pshuflw(auVar35,auVar68,0xe8);
            auVar86 = (auVar86 | auVar61 & auVar35) ^ _DAT_0073c430;
            auVar86 = packssdw(auVar86,auVar86);
            if ((auVar86 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16c8 + uVar15 * 2) = sVar8;
            }
            auVar68 = auVar67 & auVar73 | auVar68;
            auVar86 = packssdw(auVar68,auVar68);
            auVar86 = packssdw(auVar86 ^ _DAT_0073c430,auVar86 ^ _DAT_0073c430);
            if ((auVar86 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16ca + uVar15 * 2) = sVar8;
            }
            auVar86 = _DAT_0073b300;
            auVar35 = auVar54 ^ _DAT_0073b300;
            auVar81._0_4_ = -(uint)(iVar5 < auVar35._0_4_);
            auVar81._4_4_ = -(uint)(iVar74 < auVar35._4_4_);
            auVar81._8_4_ = -(uint)(iVar92 < auVar35._8_4_);
            auVar81._12_4_ = -(uint)(iVar27 < auVar35._12_4_);
            auVar69._4_4_ = auVar81._0_4_;
            auVar69._0_4_ = auVar81._0_4_;
            auVar69._8_4_ = auVar81._8_4_;
            auVar69._12_4_ = auVar81._8_4_;
            iVar5 = -(uint)(auVar35._4_4_ == iVar74);
            iVar74 = -(uint)(auVar35._12_4_ == iVar27);
            auVar60._4_4_ = iVar5;
            auVar60._0_4_ = iVar5;
            auVar60._8_4_ = iVar74;
            auVar60._12_4_ = iVar74;
            in_XMM7._4_4_ = auVar81._4_4_;
            in_XMM7._0_4_ = auVar81._4_4_;
            in_XMM7._8_4_ = auVar81._12_4_;
            in_XMM7._12_4_ = auVar81._12_4_;
            auVar35 = packssdw(auVar81,auVar60 & auVar69 | in_XMM7);
            in_XMM9._8_4_ = 0xffffffff;
            in_XMM9._0_8_ = 0xffffffffffffffff;
            in_XMM9._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ in_XMM9,auVar35 ^ in_XMM9);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16cc + uVar15 * 2) = sVar8;
            }
            auVar61 = pshufhw(auVar69,auVar69,0x84);
            auVar35 = pshufhw(auVar60,auVar60,0x84);
            auVar70 = pshufhw(auVar61,in_XMM7,0x84);
            in_XMM6 = (auVar70 | auVar35 & auVar61) ^ in_XMM9;
            auVar35 = packssdw(auVar35 & auVar61,in_XMM6);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar7 + 0x8f16ce + uVar15 * 2) = sVar8;
            }
            uVar15 = uVar15 + 8;
            lVar13 = auVar29._8_8_;
            lVar16 = (long)DAT_0073c1b0;
            auVar29._0_8_ = auVar29._0_8_ + lVar16;
            lVar63 = DAT_0073c1b0._8_8_;
            auVar29._8_8_ = lVar13 + lVar63;
            lVar13 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + lVar16;
            auVar34._8_8_ = lVar13 + lVar63;
            lVar13 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + lVar16;
            auVar43._8_8_ = lVar13 + lVar63;
            lVar13 = auVar54._8_8_;
            auVar54._0_8_ = auVar54._0_8_ + lVar16;
            auVar54._8_8_ = lVar13 + lVar63;
            in_XMM5 = _DAT_0073c1b0;
          } while (((ulong)uVar11 + 7 & 0x1fffffff8) != uVar15);
        }
        dc_colormap = plVar1 + (uint)(iVar88 << 8);
        auVar79._8_4_ = 0xffffffff;
        auVar79._0_8_ = 0xffffffffffffffff;
        auVar79._12_4_ = 0xffffffff;
        iVar5 = iVar88;
      }
      uVar11 = (uint)uclip[lVar12];
      uVar18 = (uint)dclip[lVar12];
      iVar9 = iVar9 + -1;
      lVar21 = lVar21 + -1;
      bVar2 = x1 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar2);
  }
  if (((int)uVar11 < (int)uVar18) && (iVar5 != 0)) {
    R_DrawFogBoundarySection(uVar11,uVar18,x1);
    return;
  }
  return;
}

Assistant:

void R_DrawFogBoundary (int x1, int x2, short *uclip, short *dclip)
{
	// This is essentially the same as R_MapVisPlane but with an extra step
	// to create new horizontal spans whenever the light changes enough that
	// we need to use a new colormap.

	double lightstep = rw_lightstep;
	double light = rw_light + rw_lightstep*(x2-x1-1);
	int x = x2-1;
	int t2 = uclip[x];
	int b2 = dclip[x];
	int rcolormap = GETPALOOKUP(light, wallshade);
	int lcolormap;
	BYTE *basecolormapdata = basecolormap->Maps;

	if (b2 > t2)
	{
		clearbufshort (spanend+t2, b2-t2, x);
	}

	dc_colormap = basecolormapdata + (rcolormap << COLORMAPSHIFT);

	for (--x; x >= x1; --x)
	{
		int t1 = uclip[x];
		int b1 = dclip[x];
		const int xr = x+1;
		int stop;

		light -= rw_lightstep;
		lcolormap = GETPALOOKUP(light, wallshade);
		if (lcolormap != rcolormap)
		{
			if (t2 < b2 && rcolormap != 0)
			{ // Colormap 0 is always the identity map, so rendering it is
			  // just a waste of time.
				R_DrawFogBoundarySection (t2, b2, xr);
			}
			if (t1 < t2) t2 = t1;
			if (b1 > b2) b2 = b1;
			if (t2 < b2)
			{
				clearbufshort (spanend+t2, b2-t2, x);
			}
			rcolormap = lcolormap;
			dc_colormap = basecolormapdata + (lcolormap << COLORMAPSHIFT);
		}
		else
		{
			if (dc_colormap != basecolormapdata)
			{
				stop = MIN (t1, b2);
				while (t2 < stop)
				{
					R_DrawFogBoundaryLine (t2++, xr);
				}
				stop = MAX (b1, t2);
				while (b2 > stop)
				{
					R_DrawFogBoundaryLine (--b2, xr);
				}
			}
			else
			{
				t2 = MAX (t2, MIN (t1, b2));
				b2 = MIN (b2, MAX (b1, t2));
			}

			stop = MIN (t2, b1);
			while (t1 < stop)
			{
				spanend[t1++] = x;
			}
			stop = MAX (b2, t2);
			while (b1 > stop)
			{
				spanend[--b1] = x;
			}
		}

		t2 = uclip[x];
		b2 = dclip[x];
	}
	if (t2 < b2 && rcolormap != 0)
	{
		R_DrawFogBoundarySection (t2, b2, x1);
	}
}